

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.cxx
# Opt level: O0

int __thiscall Fl_Widget::take_focus(Fl_Widget *this)

{
  uint uVar1;
  int iVar2;
  Fl_Widget *o;
  Fl_Widget *this_local;
  
  uVar1 = takesevents(this);
  if (uVar1 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    uVar1 = visible_focus(this);
    if (uVar1 == 0) {
      this_local._4_4_ = 0;
    }
    else {
      iVar2 = (*this->_vptr_Fl_Widget[3])(this,6);
      if (iVar2 == 0) {
        this_local._4_4_ = 0;
      }
      else {
        o = Fl::focus();
        iVar2 = contains(this,o);
        if (iVar2 == 0) {
          Fl::focus(this);
          this_local._4_4_ = 1;
        }
        else {
          this_local._4_4_ = 1;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Widget::take_focus() {
  if (!takesevents()) return 0;
  if (!visible_focus()) return 0;
  if (!handle(FL_FOCUS)) return 0; // see if it wants it
  if (contains(Fl::focus())) return 1; // it called Fl::focus for us
  Fl::focus(this);
  return 1;
}